

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqReqRep.cpp
# Opt level: O2

void __thiscall adios2::zmq::ZmqReqRep::ZmqReqRep(ZmqReqRep *this)

{
  void *pvVar1;
  allocator local_94;
  allocator local_93;
  allocator local_92;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  (this->m_ReceiverBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_Context = (void *)0x0;
  (this->m_ReceiverBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ReceiverBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_Socket = (void *)0x0;
  pvVar1 = (void *)zmq_ctx_new();
  this->m_Context = pvVar1;
  if (pvVar1 == (void *)0x0) {
    std::__cxx11::string::string((string *)&local_30,"Toolkit",&local_91);
    std::__cxx11::string::string((string *)&local_50,"ZmqReqRep",&local_92);
    std::__cxx11::string::string((string *)&local_70,"ZmqReqRep",&local_93);
    std::__cxx11::string::string((string *)&local_90,"creating zmq context failed",&local_94);
    helper::Throw<std::runtime_error>(&local_30,&local_50,&local_70,&local_90,-1);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

ZmqReqRep::ZmqReqRep()
{
    m_Context = zmq_ctx_new();
    if (not m_Context)
    {
        helper::Throw<std::runtime_error>("Toolkit", "ZmqReqRep", "ZmqReqRep",
                                          "creating zmq context failed");
    }
}